

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

boolean water_prayer(boolean bless_water)

{
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *local_58;
  char *local_30;
  bool local_26;
  bool local_25;
  byte local_24;
  byte local_23;
  boolean bc_known;
  long lStack_20;
  boolean other;
  long changed;
  obj *otmp;
  boolean bless_water_local;
  
  lStack_20 = 0;
  bVar1 = false;
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((local_23 = 1, ublindf != (obj *)0x0 && (local_23 = 1, ublindf->oartifact == '\x1d')))) {
    local_24 = 0;
    if (u.uprops[0x23].intrinsic != 0) {
      local_25 = true;
      if (u.uprops[0x24].extrinsic == 0) {
        local_26 = false;
        if (u.umonnum != u.umonster) {
          bVar2 = dmgtype(youmonst.data,0x24);
          local_26 = bVar2 != '\0';
        }
        local_25 = local_26;
      }
      local_24 = local_25 ^ 0xff;
    }
    local_23 = local_24;
  }
  changed = (long)level->objects[u.ux][u.uy];
  do {
    if (changed == 0) {
      if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))
            ) && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && (lStack_20 != 0)) {
        if ((bVar1) && (1 < lStack_20)) {
          local_30 = "Some of the";
        }
        else {
          local_30 = "The";
          if (bVar1) {
            local_30 = "One of the";
          }
        }
        pcVar4 = "";
        if (bVar1 || 1 < lStack_20) {
          pcVar4 = "s";
        }
        pcVar5 = "s";
        if (1 < lStack_20) {
          pcVar5 = "";
        }
        if (bless_water == '\0') {
          local_58 = hcolor("black");
        }
        else {
          local_58 = hcolor("light blue");
        }
        pline("%s potion%s on the altar glow%s %s for a moment.",local_30,pcVar4,pcVar5,local_58);
      }
      return 0 < lStack_20;
    }
    if (*(short *)(changed + 0x2a) == 0x14f) {
      if (bless_water == '\0') {
        uVar3 = *(uint *)(changed + 0x4a);
      }
      else {
        uVar3 = *(uint *)(changed + 0x4a) >> 1;
      }
      if ((uVar3 & 1) != 0) goto LAB_002a837a;
      *(uint *)(changed + 0x4a) =
           *(uint *)(changed + 0x4a) & 0xfffffffd | ((int)bless_water & 1U) << 1;
      *(uint *)(changed + 0x4a) =
           *(uint *)(changed + 0x4a) & 0xfffffffe | (uint)(bless_water == '\0');
      *(uint *)(changed + 0x4a) =
           *(uint *)(changed + 0x4a) & 0xffffffbf | (int)(char)((local_23 ^ 0xff) & 1) << 6;
      lStack_20 = *(int *)(changed + 0x30) + lStack_20;
    }
    else {
LAB_002a837a:
      if (*(char *)(changed + 0x35) == '\b') {
        bVar1 = true;
      }
    }
    changed = *(long *)(changed + 8);
  } while( true );
}

Assistant:

static boolean water_prayer(boolean bless_water)
{
    struct obj* otmp;
    long changed = 0;
    boolean other = FALSE, bc_known = !(Blind || Hallucination);

    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
	/* turn water into (un)holy water */
	if (otmp->otyp == POT_WATER &&
		(bless_water ? !otmp->blessed : !otmp->cursed)) {
	    otmp->blessed = bless_water;
	    otmp->cursed = !bless_water;
	    otmp->bknown = bc_known;
	    changed += otmp->quan;
	} else if (otmp->oclass == POTION_CLASS)
	    other = TRUE;
    }
    if (!Blind && changed) {
	pline("%s potion%s on the altar glow%s %s for a moment.",
	      ((other && changed > 1L) ? "Some of the" :
					(other ? "One of the" : "The")),
	      ((other || changed > 1L) ? "s" : ""), (changed > 1L ? "" : "s"),
	      (bless_water ? hcolor("light blue") : hcolor("black")));
    }
    return (boolean)(changed > 0L);
}